

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<float,_4> __thiscall tcu::mix<4>(tcu *this,Vector<float,_4> *x,Vector<float,_4> *y,float a)

{
  int i;
  long lVar1;
  float fVar2;
  ulong in_XMM1_Qa;
  Vector<float,_4> VVar3;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  VVar3.m_data[0] = 1.0 - a;
  VVar3.m_data[1] = 0.0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    fVar2 = y->m_data[lVar1] * a;
    in_XMM1_Qa = (ulong)(uint)fVar2;
    *(float *)(this + lVar1 * 4) = x->m_data[lVar1] * VVar3.m_data[0] + fVar2;
  }
  VVar3.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar3.m_data[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  return (Vector<float,_4>)VVar3.m_data;
}

Assistant:

Vector<float, Size> mix (const Vector<float, Size>& x, const Vector<float, Size>& y, float a)
{
	Vector<float, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = deFloatMix(x.m_data[i], y.m_data[i], a);
	return res;
}